

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractDOMParser.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::AbstractDOMParser::notationDecl
          (AbstractDOMParser *this,XMLNotationDecl *notDecl,bool param_2)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long *plVar4;
  XMLCh *chars;
  XMLCh *chars_00;
  long *plVar3;
  
  iVar2 = (*(this->fDocument->super_DOMMemoryManager)._vptr_DOMMemoryManager[0x3c])
                    (this->fDocument,notDecl->fName);
  plVar3 = (long *)CONCAT44(extraout_var,iVar2);
  (**(code **)(*plVar3 + 0x160))(plVar3,notDecl->fPublicId);
  (**(code **)(*plVar3 + 0x168))(plVar3,notDecl->fSystemId);
  (**(code **)(*plVar3 + 0x170))(plVar3,notDecl->fBaseURI);
  iVar2 = (*(this->fDocumentType->super_DOMDocumentType).super_DOMNode._vptr_DOMNode[0x2a])();
  plVar4 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0x10))
                             ((long *)CONCAT44(extraout_var_00,iVar2),plVar3);
  if (plVar4 != (long *)0x0) {
    (**(code **)(*plVar4 + 0x138))(plVar4);
  }
  bVar1 = DOMDocumentTypeImpl::isIntSubsetReading(this->fDocumentType);
  if (bVar1) {
    XMLBuffer::append(this->fInternalSubset,L'<');
    XMLBuffer::append(this->fInternalSubset,L'!');
    XMLBuffer::append(this->fInternalSubset,(XMLCh *)XMLUni::fgNotationString);
    XMLBuffer::append(this->fInternalSubset,L' ');
    XMLBuffer::append(this->fInternalSubset,notDecl->fName);
    chars = (XMLCh *)(**(code **)(*plVar3 + 0x140))(plVar3);
    if (chars != (XMLCh *)0x0) {
      XMLBuffer::append(this->fInternalSubset,L' ');
      XMLBuffer::append(this->fInternalSubset,(XMLCh *)XMLUni::fgPubIDString);
      XMLBuffer::append(this->fInternalSubset,L' ');
      XMLBuffer::append(this->fInternalSubset,L'\"');
      XMLBuffer::append(this->fInternalSubset,chars);
      XMLBuffer::append(this->fInternalSubset,L'\"');
    }
    chars_00 = (XMLCh *)(**(code **)(*plVar3 + 0x148))(plVar3);
    if (chars_00 != (XMLCh *)0x0) {
      XMLBuffer::append(this->fInternalSubset,L' ');
      if (chars == (XMLCh *)0x0) {
        XMLBuffer::append(this->fInternalSubset,(XMLCh *)XMLUni::fgSysIDString);
        XMLBuffer::append(this->fInternalSubset,L' ');
      }
      XMLBuffer::append(this->fInternalSubset,L'\"');
      XMLBuffer::append(this->fInternalSubset,chars_00);
      XMLBuffer::append(this->fInternalSubset,L'\"');
    }
    XMLBuffer::append(this->fInternalSubset,L'>');
    return;
  }
  return;
}

Assistant:

void AbstractDOMParser::notationDecl
(
    const   XMLNotationDecl&    notDecl
    , const bool
)
{
    DOMNotationImpl* notation = (DOMNotationImpl *)fDocument->createNotation(notDecl.getName());
    notation->setPublicId(notDecl.getPublicId());
    notation->setSystemId(notDecl.getSystemId());
    notation->setBaseURI(notDecl.getBaseURI());

    DOMNode* rem = fDocumentType->getNotations()->setNamedItem( notation );
    if (rem)
        rem->release();

    if (fDocumentType->isIntSubsetReading())
    {
        //add thes chars to internalSubset variable
        fInternalSubset.append(chOpenAngle);
        fInternalSubset.append(chBang);
        fInternalSubset.append(XMLUni::fgNotationString);
        fInternalSubset.append(chSpace);

        fInternalSubset.append(notDecl.getName());

        bool publicKeywordPrinted = false;

        const XMLCh* id = notation->getPublicId();
        if (id != 0) {
            fInternalSubset.append(chSpace);
            fInternalSubset.append(XMLUni::fgPubIDString);
            fInternalSubset.append(chSpace);
            fInternalSubset.append(chDoubleQuote);
            fInternalSubset.append(id);
            fInternalSubset.append(chDoubleQuote);

            publicKeywordPrinted = true;
        }
        id = notation->getSystemId();
        if (id != 0) {
            fInternalSubset.append(chSpace);

            if ( !publicKeywordPrinted ){
				fInternalSubset.append(XMLUni::fgSysIDString);
				fInternalSubset.append(chSpace);
			}

            fInternalSubset.append(chDoubleQuote);
            fInternalSubset.append(id);
            fInternalSubset.append(chDoubleQuote);
        }
        fInternalSubset.append(chCloseAngle);
    }
}